

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mum.cc
# Opt level: O2

void mum_hash_test(void *key,int len,uint32_t seed,void *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  ulong uVar11;
  uint64_t *puVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  
  uVar11 = (ulong)len;
  puVar12 = _mum_primes;
  uVar10 = seed + uVar11;
  uVar15 = 0xc42b5e2e6480b23b;
  for (; auVar1._8_8_ = 0, auVar1._0_8_ = uVar15, auVar7._8_8_ = 0, auVar7._0_8_ = uVar10,
      uVar10 = SUB168(auVar1 * auVar7,0) + SUB168(auVar1 * auVar7,8), 0x20 < uVar11;
      uVar11 = uVar11 - 0x20) {
    for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 8) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)((long)_mum_primes + lVar14);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)((long)key + lVar14);
      uVar10 = uVar10 ^ SUB168(auVar2 * auVar8,8) + SUB168(auVar2 * auVar8,0);
    }
    key = (void *)((long)key + 0x20);
    uVar15 = 0x7b51ec3d22f7096f;
  }
  for (uVar15 = 0; uVar15 < uVar11 >> 3; uVar15 = uVar15 + 1) {
    uVar13 = *puVar12;
    puVar12 = puVar12 + 1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar13;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(ulong *)((long)key + uVar15 * 8);
    uVar10 = uVar10 ^ SUB168(auVar3 * auVar9,8) + SUB168(auVar3 * auVar9,0);
  }
  uVar15 = (ulong)((uint)uVar11 & 0x38);
  switch((uint)uVar11 & 7) {
  case 0:
    goto switchD_0016cf84_caseD_0;
  case 1:
    uVar11 = (ulong)*(byte *)((long)key + uVar15);
    break;
  case 2:
    uVar11 = (ulong)*(ushort *)((long)key + uVar15);
    break;
  case 3:
    uVar13 = (ulong)*(ushort *)((long)key + uVar15);
    uVar11 = (ulong)*(byte *)((long)key + uVar15 + 2) << 0x10;
    goto LAB_0016cfdd;
  case 4:
    uVar11 = (ulong)*(uint *)((long)key + uVar15);
    break;
  case 5:
    uVar13 = (ulong)*(uint *)((long)key + uVar15);
    uVar11 = (ulong)*(byte *)((long)key + uVar15 + 4) << 0x20;
    goto LAB_0016cfdd;
  case 6:
    uVar11 = (ulong)CONCAT15(*(undefined1 *)((long)key + uVar15 + 5),
                             CONCAT14(*(undefined1 *)((long)key + uVar15 + 4),
                                      *(undefined4 *)((long)key + uVar15)));
    break;
  case 7:
    uVar11 = (ulong)*(byte *)((long)key + uVar15 + 6) << 0x30;
    uVar13 = (ulong)CONCAT15(*(undefined1 *)((long)key + uVar15 + 5),
                             CONCAT14(*(undefined1 *)((long)key + uVar15 + 4),
                                      *(undefined4 *)((long)key + uVar15)));
LAB_0016cfdd:
    uVar11 = uVar11 | uVar13;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar11;
  uVar10 = uVar10 ^ SUB168(auVar4 * ZEXT816(0xaf47d47c99b1461b),8) +
                    SUB168(auVar4 * ZEXT816(0xaf47d47c99b1461b),0);
switchD_0016cf84_caseD_0:
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar10;
  uVar10 = SUB168(auVar5 * ZEXT816(0xa9a7ae7ceff79f3f),8) +
           SUB168(auVar5 * ZEXT816(0xa9a7ae7ceff79f3f),0) ^ uVar10;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar10;
  *(ulong *)out =
       SUB168(auVar6 * ZEXT816(0xaf47d47c99b1461b),8) +
       SUB168(auVar6 * ZEXT816(0xaf47d47c99b1461b),0) ^ uVar10;
  return;
}

Assistant:

void mum_hash_test(const void *key, int len, uint32_t seed, void *out) {
  *(uint64_t *)out = mum_hash(key, len, seed);
}